

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallFileGenerator::LoadConfigFiles(cmExportInstallFileGenerator *this,ostream *os)

{
  ostream *poVar1;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  cmExportInstallFileGenerator *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  poVar1 = std::operator<<(os,"# Load information for each installed configuration.\n");
  poVar1 = std::operator<<(poVar1,"file(GLOB _cmake_config_files \"${CMAKE_CURRENT_LIST_DIR}/");
  GetConfigImportFileGlob_abi_cxx11_(&local_38,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"\")\n");
  poVar1 = std::operator<<(poVar1,"foreach(_cmake_config_file IN LISTS _cmake_config_files)\n");
  poVar1 = std::operator<<(poVar1,"  include(\"${_cmake_config_file}\")\n");
  poVar1 = std::operator<<(poVar1,"endforeach()\n");
  poVar1 = std::operator<<(poVar1,"unset(_cmake_config_file)\n");
  poVar1 = std::operator<<(poVar1,"unset(_cmake_config_files)\n");
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmExportInstallFileGenerator::LoadConfigFiles(std::ostream& os)
{
  // Now load per-configuration properties for them.
  /* clang-format off */
  os << "# Load information for each installed configuration.\n"
     << "file(GLOB _cmake_config_files \"${CMAKE_CURRENT_LIST_DIR}/"
     << this->GetConfigImportFileGlob() << "\")\n"
     << "foreach(_cmake_config_file IN LISTS _cmake_config_files)\n"
     << "  include(\"${_cmake_config_file}\")\n"
     << "endforeach()\n"
     << "unset(_cmake_config_file)\n"
     << "unset(_cmake_config_files)\n"
     << "\n";
  /* clang-format on */
}